

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int readline_memory(char *line,size_t line_size,char *filedata,size_t filedata_len,
                   size_t *filedata_offset)

{
  size_t sVar1;
  ulong local_40;
  size_t len;
  size_t off;
  size_t *filedata_offset_local;
  size_t filedata_len_local;
  char *filedata_local;
  size_t line_size_local;
  char *line_local;
  
  sVar1 = *filedata_offset;
  for (local_40 = 0;
      ((sVar1 + local_40 < filedata_len && local_40 < line_size - 1 &&
       (filedata[sVar1 + local_40] != '\n')) && (filedata[sVar1 + local_40] != '\r'));
      local_40 = local_40 + 1) {
  }
  if (local_40 != 0) {
    memcpy(line,filedata + sVar1,local_40);
    *filedata_offset = local_40 + *filedata_offset;
  }
  line[local_40] = '\0';
  *filedata_offset = *filedata_offset + 1;
  return 0;
}

Assistant:

static int
readline_memory(char *line, size_t line_size,
                const char *filedata, size_t filedata_len,
                size_t *filedata_offset)
{
    size_t off, len;

    off = *filedata_offset;

    for(len = 0; off + len < filedata_len && len < line_size - 1; len++) {
        if(filedata[off + len] == '\n' ||
            filedata[off + len] == '\r') {
                break;
        }
    }

    if(len) {
        memcpy(line, filedata + off, len);
        *filedata_offset += len;
    }

    line[len] = '\0';
    *filedata_offset += 1;

    return 0;
}